

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

Status * __thiscall
draco::Decoder::DecodeBufferToGeometry(Decoder *this,DecoderBuffer *in_buffer,Mesh *out_geometry)

{
  bool bVar1;
  undefined1 uVar2;
  DecoderBuffer *in_buffer_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Status *in_RDI;
  DracoHeader *in_stack_00000050;
  unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> decoder;
  StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
  _statusor122;
  DracoHeader header;
  DecoderBuffer temp_buffer;
  Status *_local_status;
  undefined4 in_stack_fffffffffffffec8;
  Code in_stack_fffffffffffffecc;
  Mesh *in_stack_fffffffffffffed0;
  DecoderOptions *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  Status *__s;
  undefined1 local_d1;
  StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_> local_d0;
  allocator<char> local_99;
  string local_98 [7];
  uint8_t in_stack_ffffffffffffff6f;
  char local_5d;
  
  __s = in_RDI;
  PointCloudDecoder::DecodeHeader
            ((DecoderBuffer *)
             decoder._M_t.
             super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
             super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl,in_stack_00000050);
  bVar1 = Status::ok(in_RDI);
  if (bVar1) {
    Status::~Status((Status *)0x14dab1);
    if (local_5d == '\x01') {
      CreateMeshDecoder(in_stack_ffffffffffffff6f);
      uVar2 = StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
              ::ok((StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
                    *)0x14dbaa);
      if ((bool)uVar2) {
        in_buffer_00 = (DecoderBuffer *)
                       StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
                       ::value(&local_d0);
        in_stack_fffffffffffffed0 = (Mesh *)&stack0xffffffffffffff20;
        std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>::unique_ptr
                  ((unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)
                   in_stack_fffffffffffffed0,
                   (unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>::operator->
                  ((unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)
                   0x14dc56);
        MeshDecoder::Decode((MeshDecoder *)CONCAT17(uVar2,in_stack_fffffffffffffee8),
                            in_stack_fffffffffffffee0,in_buffer_00,in_stack_fffffffffffffed0);
        bVar1 = Status::ok(in_RDI);
        if (bVar1) {
          Status::~Status((Status *)0x14dcf8);
          OkStatus();
        }
        std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>::~unique_ptr
                  ((unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)
                   in_stack_fffffffffffffed0);
      }
      else {
        local_d1 = 0;
        StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
        status(&local_d0);
        Status::Status((Status *)in_stack_fffffffffffffed0,
                       (Status *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        local_d1 = 1;
      }
      StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
      ~StatusOr((StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
                 *)in_stack_fffffffffffffed0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RSI,(char *)__s,(allocator<char> *)in_RDI);
      Status::Status((Status *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                     (string *)0x14db17);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator(&local_99);
    }
  }
  DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x14dd59);
  return __s;
}

Assistant:

Status Decoder::DecodeBufferToGeometry(DecoderBuffer *in_buffer,
                                       Mesh *out_geometry) {
#ifdef DRACO_MESH_COMPRESSION_SUPPORTED
  DecoderBuffer temp_buffer(*in_buffer);
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(PointCloudDecoder::DecodeHeader(&temp_buffer, &header))
  if (header.encoder_type != TRIANGULAR_MESH) {
    return Status(Status::DRACO_ERROR, "Input is not a mesh.");
  }
  DRACO_ASSIGN_OR_RETURN(std::unique_ptr<MeshDecoder> decoder,
                         CreateMeshDecoder(header.encoder_method))

  DRACO_RETURN_IF_ERROR(decoder->Decode(options_, in_buffer, out_geometry))
  return OkStatus();
#else
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
#endif
}